

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

void __thiscall Matrix4f::transpose(Matrix4f *this)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Matrix4f *in_RDI;
  int j;
  int i;
  float temp;
  undefined4 local_14;
  undefined4 local_10;
  
  for (local_10 = 0; local_14 = local_10, local_10 < 3; local_10 = local_10 + 1) {
    while (local_14 = local_14 + 1, local_14 < 4) {
      pfVar3 = operator()(in_RDI,local_10,local_14);
      fVar1 = *pfVar3;
      pfVar3 = operator()(in_RDI,local_14,local_10);
      fVar2 = *pfVar3;
      pfVar3 = operator()(in_RDI,local_10,local_14);
      *pfVar3 = fVar2;
      pfVar3 = operator()(in_RDI,local_14,local_10);
      *pfVar3 = fVar1;
    }
  }
  return;
}

Assistant:

void Matrix4f::transpose()
{
	float temp;

	for( int i = 0; i < 3; ++i )
	{
		for( int j = i + 1; j < 4; ++j )
		{
			temp = ( *this )( i, j );
			( * this )( i, j ) = ( *this )( j, i );
			( *this )( j, i ) = temp;
		}
	}
}